

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenStringSliceIter
          (BinaryenModuleRef module,BinaryenExpressionRef ref,BinaryenExpressionRef num)

{
  StringSliceIter *pSVar1;
  Builder local_10;
  
  local_10.wasm = module;
  pSVar1 = wasm::Builder::makeStringSliceIter(&local_10,ref,num);
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenStringSliceIter(BinaryenModuleRef module,
                                              BinaryenExpressionRef ref,
                                              BinaryenExpressionRef num) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeStringSliceIter((Expression*)ref, (Expression*)num));
}